

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepTiledInputFile::DeepTiledInputFile
          (DeepTiledInputFile *this,char *filename,ContextInitializer *ctxtinit,int numThreads)

{
  int local_28;
  int local_24;
  DeepTiledInputFile *local_20;
  
  local_24 = numThreads;
  Context::Context();
  local_28 = 0;
  local_20 = this;
  std::make_shared<Imf_3_4::DeepTiledInputFile::Data,Imf_3_4::Context*,int,int&>
            ((Context **)&this->_data,(int *)&local_20,&local_28);
  Data::initialize((this->_data).
                   super___shared_ptr<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
  return;
}

Assistant:

DeepTiledInputFile::DeepTiledInputFile (
    const char*               filename,
    const ContextInitializer& ctxtinit,
    int                       numThreads)
    : _ctxt (filename, ctxtinit, Context::read_mode_t{})
    , _data (std::make_shared<Data> (&_ctxt, 0, numThreads))
{
    _data->initialize ();
}